

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O3

void __thiscall QPrintDialogPrivate::setTabs(QPrintDialogPrivate *this,QList<QWidget_*> *tabWidgets)

{
  long lVar1;
  QWidget *pQVar2;
  QWidget *pQVar3;
  QWidget **ppQVar4;
  long in_FS_OFFSET;
  QArrayData *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tabWidgets->d).size != 0) {
    ppQVar4 = (tabWidgets->d).ptr;
    do {
      pQVar2 = *ppQVar4;
      pQVar3 = (QWidget *)(this->options).super_Ui_QPrintSettingsOutput.tabs;
      QWidget::windowTitle();
      QTabWidget::addTab(pQVar3,(QString *)pQVar2);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      ppQVar4 = ppQVar4 + 1;
    } while (ppQVar4 != (tabWidgets->d).ptr + (tabWidgets->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialogPrivate::setTabs(const QList<QWidget*> &tabWidgets)
{
    QList<QWidget*>::ConstIterator iter = tabWidgets.begin();
    while(iter != tabWidgets.constEnd()) {
        QWidget *tab = *iter;
        options.tabs->addTab(tab, tab->windowTitle());
        ++iter;
    }
}